

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationUtil.cpp
# Opt level: O2

GraphicsPipelineBuilder * __thiscall
vkt::tessellation::GraphicsPipelineBuilder::setVertexInputSingleAttribute
          (GraphicsPipelineBuilder *this,VkFormat vertexFormat,deUint32 stride)

{
  pointer pVVar1;
  pointer pVVar2;
  VkVertexInputBindingDescription bindingDesc;
  VkVertexInputAttributeDescription attributeDesc;
  value_type local_24;
  value_type local_18;
  
  local_24.binding = 0;
  local_24.inputRate = VK_VERTEX_INPUT_RATE_VERTEX;
  local_18.location = 0;
  local_18.binding = 0;
  local_18.offset = 0;
  pVVar1 = (this->m_vertexInputBindings).
           super__Vector_base<vk::VkVertexInputBindingDescription,_std::allocator<vk::VkVertexInputBindingDescription>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->m_vertexInputBindings).
      super__Vector_base<vk::VkVertexInputBindingDescription,_std::allocator<vk::VkVertexInputBindingDescription>_>
      ._M_impl.super__Vector_impl_data._M_finish != pVVar1) {
    (this->m_vertexInputBindings).
    super__Vector_base<vk::VkVertexInputBindingDescription,_std::allocator<vk::VkVertexInputBindingDescription>_>
    ._M_impl.super__Vector_impl_data._M_finish = pVVar1;
  }
  local_24.stride = stride;
  local_18.format = vertexFormat;
  std::
  vector<vk::VkVertexInputBindingDescription,_std::allocator<vk::VkVertexInputBindingDescription>_>
  ::push_back(&this->m_vertexInputBindings,&local_24);
  pVVar2 = (this->m_vertexInputAttributes).
           super__Vector_base<vk::VkVertexInputAttributeDescription,_std::allocator<vk::VkVertexInputAttributeDescription>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->m_vertexInputAttributes).
      super__Vector_base<vk::VkVertexInputAttributeDescription,_std::allocator<vk::VkVertexInputAttributeDescription>_>
      ._M_impl.super__Vector_impl_data._M_finish != pVVar2) {
    (this->m_vertexInputAttributes).
    super__Vector_base<vk::VkVertexInputAttributeDescription,_std::allocator<vk::VkVertexInputAttributeDescription>_>
    ._M_impl.super__Vector_impl_data._M_finish = pVVar2;
  }
  std::
  vector<vk::VkVertexInputAttributeDescription,_std::allocator<vk::VkVertexInputAttributeDescription>_>
  ::push_back(&this->m_vertexInputAttributes,&local_18);
  return this;
}

Assistant:

GraphicsPipelineBuilder& GraphicsPipelineBuilder::setVertexInputSingleAttribute (const VkFormat vertexFormat, const deUint32 stride)
{
	const VkVertexInputBindingDescription bindingDesc =
	{
		0u,									// uint32_t				binding;
		stride,								// uint32_t				stride;
		VK_VERTEX_INPUT_RATE_VERTEX,		// VkVertexInputRate	inputRate;
	};
	const VkVertexInputAttributeDescription attributeDesc =
	{
		0u,									// uint32_t			location;
		0u,									// uint32_t			binding;
		vertexFormat,						// VkFormat			format;
		0u,									// uint32_t			offset;
	};

	m_vertexInputBindings.clear();
	m_vertexInputBindings.push_back(bindingDesc);

	m_vertexInputAttributes.clear();
	m_vertexInputAttributes.push_back(attributeDesc);

	return *this;
}